

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cc
# Opt level: O0

LogHandler * google::protobuf::SetLogHandler(LogHandler *new_func)

{
  LogHandler *local_18;
  LogHandler *old;
  LogHandler *new_func_local;
  
  local_18 = (LogHandler *)internal::log_handler__abi_cxx11_;
  if ((code *)internal::log_handler__abi_cxx11_ == internal::NullLogHandler) {
    local_18 = (LogHandler *)0x0;
  }
  internal::log_handler__abi_cxx11_ = new_func;
  if (new_func == (LogHandler *)0x0) {
    internal::log_handler__abi_cxx11_ = internal::NullLogHandler;
  }
  return local_18;
}

Assistant:

LogHandler* SetLogHandler(LogHandler* new_func) {
  LogHandler* old = internal::log_handler_;
  if (old == &internal::NullLogHandler) {
    old = nullptr;
  }
  if (new_func == nullptr) {
    internal::log_handler_ = &internal::NullLogHandler;
  } else {
    internal::log_handler_ = new_func;
  }
  return old;
}